

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O3

void __thiscall SFFile::TranslatePercussionPreset(SFFile *this,SFPreset *preset)

{
  ushort uVar1;
  SFBag *pSVar2;
  ushort uVar3;
  long lVar4;
  ulong uVar5;
  
  uVar1 = preset->BagIndex;
  uVar5 = (ulong)uVar1;
  uVar3 = preset[1].BagIndex;
  if (uVar1 < uVar3) {
    lVar4 = (ulong)((uint)uVar1 * 4) * 3;
    do {
      pSVar2 = this->PresetBags;
      if (((-1 < *(int *)((long)&pSVar2->Target + lVar4)) &&
          (-1 < (char)(&(pSVar2->KeyRange).Lo)[lVar4])) &&
         (-1 < (char)(&(pSVar2->VelRange).Lo)[lVar4])) {
        TranslatePercussionPresetZone(this,preset,(SFBag *)((long)&pSVar2->GenIndex + lVar4));
        uVar3 = preset[1].BagIndex;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0xc;
    } while (uVar5 < uVar3);
  }
  return;
}

Assistant:

void SFFile::TranslatePercussionPreset(SFPreset *preset)
{
	SFPerc perc;
	int i;
	bool has_global;
	
	perc.LoadOrder = preset->LoadOrder;
	i = preset->BagIndex;
	has_global = false;

	for (i = preset->BagIndex; i < (preset + 1)->BagIndex; ++i)
	{
		if (PresetBags[i].Target < 0)
		{ // This preset zone has no instrument.
			continue;
		}
		if (PresetBags[i].KeyRange.Lo > 127 || PresetBags[i].VelRange.Lo > 127)
		{ // This preset zone is inaccesible.
			continue;
		}
		TranslatePercussionPresetZone(preset, &PresetBags[i]);
	}
}